

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall StringOutput::rawprint(StringOutput *this,char *data,size_t size)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  std::__cxx11::string::replace
            ((ulong)this->result,this->result->_M_string_length,(char *)0x0,(ulong)data);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

virtual void rawprint(const char* data, size_t size)
	{
		std::unique_lock<std::mutex> lock(mutex);

		result.insert(result.end(), data, data + size);
	}